

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

ParseNodeCatch * __thiscall Parser::ParseCatch<true>(Parser *this)

{
  undefined1 *puVar1;
  Scanner_t *this_00;
  ParseNodePtr **pppPVar2;
  tokens tVar3;
  tokens tVar4;
  int scopeId;
  Scope *this_01;
  code *pcVar5;
  bool bVar6;
  charcount_t cVar7;
  charcount_t ichLim;
  anon_union_8_2_ecfd7102_for_StmtNest_0 aVar8;
  undefined4 *puVar9;
  ParseNodePtr pPVar10;
  ParseNodeType *pPVar11;
  IdentPtr pIVar12;
  ParseNodeFnc *pPVar13;
  PidRefStack *ref;
  ParseNodeName *this_02;
  Symbol *this_03;
  ParseNodeBlock *pPVar14;
  HRESULT hr;
  Parser *this_04;
  ScopeType SVar15;
  ParseNodePtr **pppPVar16;
  Parser *this_05;
  anon_union_8_2_ecfd7102_for_StmtNest_0 local_90;
  StmtNest stmt;
  SymbolName symName;
  Parser *local_60;
  ParseNodePtr **local_58;
  ParseNodeBlock *local_40;
  
  if ((this->m_token).tk != tkCATCH) {
    return (ParseNodeCatch *)0x0;
  }
  this_05 = (Parser *)&this->m_token;
  this_00 = &this->m_scan;
  cVar7 = Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok(this_00);
  aVar8._4_4_ = 0;
  aVar8._0_4_ = cVar7;
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  tVar3 = (this->m_token).tk;
  if (tVar3 == tkLParen) {
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
    tVar4 = (this->m_token).tk;
    if (tVar4 == tkID) goto LAB_00ea2994;
    SVar15 = (ScopeType)(tVar4 == tkLBrack || tVar4 == tkLCurly);
    if ((tVar4 == tkLCurly) || (tVar4 == tkLBrack)) goto LAB_00ea2997;
    IdentifierExpectedError(this,(Token *)this_05);
    this_05 = (Parser *)this_00;
LAB_00ea2f2e:
    if ((this->m_currentNodeFunc != (ParseNodeFnc *)0x0) &&
       ((this->m_currentNodeFunc->fncFlags & kFunctionStrictMode) != kFunctionNone)) {
LAB_00ea2bfb:
      this_04 = this_05;
      pIVar12 = Token::GetIdentifier((Token *)this_05,&(this->m_scan).m_htbl);
      if (pIVar12 == (this->wellKnownPropertyPids).eval) {
        hr = -0x7ff5fbef;
        goto LAB_00ea2f5e;
      }
      if (pIVar12 == (this->wellKnownPropertyPids).arguments) {
        hr = -0x7ff5fbee;
        goto LAB_00ea2f5e;
      }
    }
    pIVar12 = Token::GetIdentifier((Token *)this_05,&(this->m_scan).m_htbl);
    scopeId = this->m_currentBlockInfo->pnodeBlock->blockId;
    pPVar13 = GetCurrentFunctionNode(this);
    ref = FindOrAddPidRef(this,pIVar12,scopeId,pPVar13->functionId);
    this_02 = CreateNameNode(this,pIVar12);
    ParseNodeName::SetSymRef(this_02,ref);
    Memory::Recycler::WBSetBit((char *)&stmt.pstmtOuter);
    stmt.pstmtOuter = (StmtNest *)&pIVar12->field_0x22;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&stmt.pstmtOuter);
    this_03 = (Symbol *)new<Memory::ArenaAllocator>(0x50,&this->m_nodeAllocator,0x366bee);
    Symbol::Symbol(this_03,(SymbolName *)&stmt.pstmtOuter,&this_02->super_ParseNode,STVariable);
    this_03->pid = pIVar12;
    if (ref->sym != (Symbol *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,10000,"(ref->GetSym() == nullptr)","ref->GetSym() == nullptr");
      if (!bVar6) goto LAB_00ea2f50;
      *puVar9 = 0;
    }
    ref->sym = this_03;
    this_01 = local_40->scope;
    Scope::AddNewSymbol(this_01,this_03);
    *(ParseNodeName **)((long)aVar8 + 0x28) = this_02;
    *(Scope **)((long)aVar8 + 0x40) = this_01;
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan
              ((Scanner<UTF8EncodingPolicyBase<false>_> *)local_60);
  }
  else {
LAB_00ea2994:
    SVar15 = ScopeType_Unknown;
LAB_00ea2997:
    ichLim = Scanner<UTF8EncodingPolicyBase<false>_>::IchLimTok(this_00);
    aVar8 = (anon_union_8_2_ecfd7102_for_StmtNest_0)CreateNodeForOpT<(OpCode)106>(this,cVar7,ichLim)
    ;
    *(ParseNodePtr *)((long)aVar8 + 0x20) = (ParseNodePtr)0x0;
    *(uint *)((long)aVar8 + 0x10) = 0;
    stmt.field_0 = (anon_union_8_2_ecfd7102_for_StmtNest_0)0x0;
    stmt.pLabelId = (LabelId *)this->m_pstmtCur;
    this->m_pstmtCur = (StmtNest *)&local_90;
    local_90 = aVar8;
    local_40 = StartParseBlock<true>(this,Regular,SVar15 | ScopeType_Catch,(LabelId *)0x0);
    pppPVar2 = &this->m_ppnodeExprScope;
    if (this->m_ppnodeExprScope == (ParseNodePtr *)0x0) {
      if (this->m_ppnodeScope == (ParseNodePtr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x26db,"(m_ppnodeScope)","m_ppnodeScope");
        if (!bVar6) goto LAB_00ea2f50;
        *puVar9 = 0;
      }
      pppPVar16 = &this->m_ppnodeScope;
      if (**pppPVar16 != (ParseNodePtr)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x26dc,"(*m_ppnodeScope == nullptr)","*m_ppnodeScope == nullptr");
        goto joined_r0x00ea2b39;
      }
    }
    else {
      pppPVar16 = pppPVar2;
      if (*this->m_ppnodeExprScope != (ParseNodePtr)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x26d5,"(*m_ppnodeExprScope == nullptr)","*m_ppnodeExprScope == nullptr"
                          );
joined_r0x00ea2b39:
        if (!bVar6) goto LAB_00ea2f50;
        *puVar9 = 0;
      }
    }
    *(anon_union_8_2_ecfd7102_for_StmtNest_0 *)
     &((anon_union_8_2_ecfd7102_for_StmtNest_0 *)*pppPVar16)->field_1 = aVar8;
    *pppPVar16 = (ParseNodePtr *)((long)aVar8 + 0x20);
    symName._8_8_ = *pppPVar2;
    *pppPVar2 = (ParseNodePtr *)((long)aVar8 + 0x38);
    *(ParseNodePtr *)((long)aVar8 + 0x38) = (ParseNodePtr)0x0;
    local_58._0_1_ = (char)SVar15;
    local_60 = (Parser *)this_00;
    local_58 = pppPVar2;
    if ((char)local_58 == '\0') {
      if (tVar3 == tkLParen) {
        if (this->m_fUseStrictMode == 0) goto LAB_00ea2f2e;
        goto LAB_00ea2bfb;
      }
    }
    else {
      pPVar10 = ParseDestructuredLiteral<true>
                          (this,tkLET,true,true,DIC_ForceErrorOnInitializer,true,(BOOL *)0x0,
                           (BOOL *)0x0);
      pPVar11 = CreateNodeForOpT<(OpCode)115>(this,pPVar10->ichMin,pPVar10->ichLim);
      (pPVar11->super_ParseNodeUni).pnode1 = pPVar10;
      pPVar11->pnodeNext = (ParseNodePtr)0x0;
      pPVar11->location = 0xffffffff;
      *(ParseNodeType **)((long)aVar8 + 0x28) = pPVar11;
    }
    *(Scope **)((long)aVar8 + 0x40) = local_40->scope;
  }
  cVar7 = Scanner<UTF8EncodingPolicyBase<false>_>::IchLimTok
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)local_60);
  if (tVar3 == tkLParen) {
    local_60 = this;
    ChkCurTok(this,0x50,-0x7ff5fc12);
  }
  if ((this->m_token).tk != tkLCurly) {
    hr = -0x7ff5fc10;
    this_04 = local_60;
LAB_00ea2f5e:
    Error(this_04,hr,L"",L"");
  }
  pPVar10 = ParseStatement<true>(this);
  *(ParseNodePtr *)((long)aVar8 + 0x30) = pPVar10;
  *(charcount_t *)((long)aVar8 + 8) = cVar7;
  if (local_40 != (ParseNodeBlock *)0x0) {
    FinishParseBlock(this,local_40,true);
  }
  if ((local_40->field_0x5c & 0xc) != 0) {
    puVar1 = &this->m_currentBlockInfo->pnodeBlock->field_0x5c;
    *puVar1 = *puVar1 | 8;
  }
  if ((local_40->field_0x5c & 4) != 0) {
    pPVar14 = ParseNode::AsParseNodeBlock(pPVar10);
    pPVar14->field_0x5c = pPVar14->field_0x5c | 4;
  }
  if ((local_40->field_0x5c & 8) != 0) {
    pPVar14 = ParseNode::AsParseNodeBlock(pPVar10);
    pPVar14->field_0x5c = pPVar14->field_0x5c | 8;
  }
  PopStmt(this,(StmtNest *)&local_90.field_0);
  if (this->m_ppnodeExprScope == (ParseNodePtr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2756,"(m_ppnodeExprScope)","m_ppnodeExprScope");
    if (!bVar6) goto LAB_00ea2f50;
    *puVar9 = 0;
  }
  if (**local_58 != (ParseNodePtr)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x2757,"(*m_ppnodeExprScope == nullptr)","*m_ppnodeExprScope == nullptr");
    if (!bVar6) {
LAB_00ea2f50:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar9 = 0;
  }
  *local_58 = (ParseNodePtr *)symName._8_8_;
  return (ParseNodeCatch *)
         (anon_struct_2_2_44c0fed8_for_anon_union_8_2_ecfd7102_for_StmtNest_0_2)aVar8;
}

Assistant:

ParseNodeCatch * Parser::ParseCatch()
{
    ParseNodePtr *ppnodeExprScopeSave = nullptr;
    ParseNodeCatch * pnode = nullptr;
    ParseNodeBlock * pnodeCatchScope = nullptr;
    StmtNest stmt;
    IdentPtr pidCatch = nullptr;

    if (tkCATCH == m_token.tk)
    {
        charcount_t ichMin;
        if (buildAST)
        {
            ichMin = this->GetScanner()->IchMinTok();
        }
        this->GetScanner()->Scan(); //catch

        bool isPattern = false;
        bool hasParam = false;

        if (tkLParen == m_token.tk)
        {
            hasParam = true;
            this->GetScanner()->Scan(); //catch(
            if (tkID != m_token.tk)
            {
                isPattern = IsPossiblePatternStart();
                if (!isPattern)
                {
                    IdentifierExpectedError(m_token);
                }
            }
        }

        if (buildAST)
        {
            pnode = CreateNodeForOpT<knopCatch>(ichMin);
            pnode->pnodeNext = nullptr;
            PushStmt<buildAST>(&stmt, pnode, knopCatch, nullptr);
        }

        pnodeCatchScope = StartParseBlock<buildAST>(PnodeBlockType::Regular, isPattern ? ScopeType_CatchParamPattern : ScopeType_Catch);

        if (buildAST)
        {
            // Add this catch to the current scope list.

            if (m_ppnodeExprScope)
            {
                Assert(*m_ppnodeExprScope == nullptr);
                *m_ppnodeExprScope = pnode;
                m_ppnodeExprScope = &pnode->pnodeNext;
            }
            else
            {
                Assert(m_ppnodeScope);
                Assert(*m_ppnodeScope == nullptr);
                *m_ppnodeScope = pnode;
                m_ppnodeScope = &pnode->pnodeNext;
            }

            // Keep a list of function expressions (not declarations) at this scope.

            ppnodeExprScopeSave = m_ppnodeExprScope;
            m_ppnodeExprScope = &pnode->pnodeScopes;
            pnode->pnodeScopes = nullptr;
        }

        if (isPattern)
        {
            ParseNodePtr pnodePattern = ParseDestructuredLiteral<buildAST>(tkLET, true /*isDecl*/, true /*topLevel*/, DIC_ForceErrorOnInitializer);
            if (buildAST)
            {
                pnode->SetParam(CreateParamPatternNode(pnodePattern));
                Scope *scope = pnodeCatchScope->scope;
                pnode->scope = scope;
            }
        }
        else if (hasParam)
        {
            if (IsStrictMode())
            {
                IdentPtr pid = m_token.GetIdentifier(this->GetHashTbl());
                if (pid == wellKnownPropertyPids.eval)
                {
                    Error(ERREvalUsage);
                }
                else if (pid == wellKnownPropertyPids.arguments)
                {
                    Error(ERRArgsUsage);
                }
            }

            pidCatch = m_token.GetIdentifier(this->GetHashTbl());
            PidRefStack *ref = this->FindOrAddPidRef(pidCatch, GetCurrentBlock()->blockId, GetCurrentFunctionNode()->functionId);

            ParseNodeName * pnodeParam = CreateNameNode(pidCatch);
            pnodeParam->SetSymRef(ref);

            const char16 *name = reinterpret_cast<const char16*>(pidCatch->Psz());
            int nameLength = pidCatch->Cch();
            SymbolName const symName(name, nameLength);
            Symbol *sym = Anew(&m_nodeAllocator, Symbol, symName, pnodeParam, STVariable);
            if (sym == nullptr)
            {
                Error(ERRnoMemory);
            }
            sym->SetPid(pidCatch);
            Assert(ref->GetSym() == nullptr);
            ref->SetSym(sym);

            Scope *scope = pnodeCatchScope->scope;
            scope->AddNewSymbol(sym);

            if (buildAST)
            {
                pnode->SetParam(pnodeParam);
                pnode->scope = scope;
            }

            this->GetScanner()->Scan();
        }
        else
        {
            if (buildAST)
            {
                pnode->scope = pnodeCatchScope->scope;
            }
        }

        charcount_t ichLim;
        if (buildAST)
        {
            ichLim = this->GetScanner()->IchLimTok();
        }

        if (hasParam)
        {
            ChkCurTok(tkRParen, ERRnoRparen); //catch(id[:expr])
        }

        if (tkLCurly != m_token.tk)
        {
            Error(ERRnoLcurly);
        }

        ParseNodePtr pnodeBody = ParseStatement<buildAST>();  //catch(id[:expr]) {block}
        if (buildAST)
        {
            pnode->pnodeBody = pnodeBody;
            pnode->ichLim = ichLim;
        }

        if (pnodeCatchScope != nullptr)
        {
            FinishParseBlock(pnodeCatchScope);
        }

        if (pnodeCatchScope->GetCallsEval() || pnodeCatchScope->GetChildCallsEval())
        {
            GetCurrentBlock()->SetChildCallsEval(true);
        }

        if (pnodeCatchScope->GetCallsEval())
        {
            pnodeBody->AsParseNodeBlock()->SetCallsEval(true);
        }
        if (pnodeCatchScope->GetChildCallsEval())
        {
            pnodeBody->AsParseNodeBlock()->SetChildCallsEval(true);
        }

        if (buildAST)
        {
            PopStmt(&stmt);

            // Restore the lists of function expression scopes.

            Assert(m_ppnodeExprScope);
            Assert(*m_ppnodeExprScope == nullptr);
            m_ppnodeExprScope = ppnodeExprScopeSave;
        }
    }
    return pnode;
}